

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O0

int32_t anon_unknown.dwarf_2ce50c::swapFormatVersion4
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t offset;
  int32_t index;
  int32_t size;
  int32_t i_1;
  int32_t i;
  int32_t indexesLength;
  int32_t indexes [20];
  int32_t *inIndexes;
  uint8_t *outBytes;
  uint8_t *inBytes;
  UErrorCode *errorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((length < 0) || (7 < length)) {
      iVar2 = udata_readInt32_63(ds,*inData);
      i = iVar2;
      if ((length < 0) || (iVar2 * 4 <= length)) {
        for (size = 1; index = iVar2, size < 0x14 && size < iVar2; size = size + 1) {
          iVar3 = udata_readInt32_63(ds,*(int32_t *)((long)inData + (long)size * 4));
          (&i)[size] = iVar3;
        }
        for (; index < 0x14; index = index + 1) {
          (&i)[index] = -1;
        }
        if (iVar2 < 0x14) {
          if (iVar2 < 6) {
            offset = iVar2 << 2;
          }
          else {
            offset = (&i)[iVar2 + -1];
          }
        }
        else {
          offset = indexes[0x11];
        }
        if (length < 0) {
          ds_local._4_4_ = offset;
        }
        else if (length < offset) {
          udata_printError_63(ds,
                              "ucol_swap(formatVersion=4): too few bytes (%d after header) for collation data\n"
                              ,(ulong)(uint)length);
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          ds_local._4_4_ = 0;
        }
        else {
          if (inData != outData) {
            memcpy(outData,inData,(long)offset);
          }
          (*ds->swapArray32)(ds,inData,iVar2 << 2,outData,errorCode);
          if (0 < indexes[4] - indexes[3]) {
            (*ds->swapArray32)(ds,(void *)((long)inData + (long)indexes[3]),indexes[4] - indexes[3],
                               (void *)((long)outData + (long)indexes[3]),errorCode);
          }
          if (0 < indexes[6] - indexes[5]) {
            utrie2_swap_63(ds,(void *)((long)inData + (long)indexes[5]),indexes[6] - indexes[5],
                           (void *)((long)outData + (long)indexes[5]),errorCode);
          }
          if (indexes[7] - indexes[6] < 1) {
            if (0 < indexes[8] - indexes[7]) {
              (*ds->swapArray64)(ds,(void *)((long)inData + (long)indexes[7]),
                                 indexes[8] - indexes[7],(void *)((long)outData + (long)indexes[7]),
                                 errorCode);
            }
            if (indexes[9] - indexes[8] < 1) {
              if (0 < indexes[10] - indexes[9]) {
                (*ds->swapArray32)(ds,(void *)((long)inData + (long)indexes[9]),
                                   indexes[10] - indexes[9],
                                   (void *)((long)outData + (long)indexes[9]),errorCode);
              }
              if (0 < indexes[0xb] - indexes[10]) {
                (*ds->swapArray32)(ds,(void *)((long)inData + (long)indexes[10]),
                                   indexes[0xb] - indexes[10],
                                   (void *)((long)outData + (long)indexes[10]),errorCode);
              }
              if (0 < indexes[0xc] - indexes[0xb]) {
                (*ds->swapArray16)(ds,(void *)((long)inData + (long)indexes[0xb]),
                                   indexes[0xc] - indexes[0xb],
                                   (void *)((long)outData + (long)indexes[0xb]),errorCode);
              }
              if (0 < indexes[0xd] - indexes[0xc]) {
                (*ds->swapArray16)(ds,(void *)((long)inData + (long)indexes[0xc]),
                                   indexes[0xd] - indexes[0xc],
                                   (void *)((long)outData + (long)indexes[0xc]),errorCode);
              }
              if (0 < indexes[0xe] - indexes[0xd]) {
                (*ds->swapArray16)(ds,(void *)((long)inData + (long)indexes[0xd]),
                                   indexes[0xe] - indexes[0xd],
                                   (void *)((long)outData + (long)indexes[0xd]),errorCode);
              }
              if (0 < indexes[0xf] - indexes[0xe]) {
                (*ds->swapArray16)(ds,(void *)((long)inData + (long)indexes[0xe]),
                                   indexes[0xf] - indexes[0xe],
                                   (void *)((long)outData + (long)indexes[0xe]),errorCode);
              }
              if (indexes[0x11] - indexes[0x10] < 1) {
                ds_local._4_4_ = offset;
              }
              else {
                udata_printError_63(ds,
                                    "ucol_swap(formatVersion=4): unknown data at IX_RESERVED18_OFFSET\n"
                                    ,(ulong)(uint)(indexes[0x11] - indexes[0x10]));
                *errorCode = U_UNSUPPORTED_ERROR;
                ds_local._4_4_ = 0;
              }
            }
            else {
              udata_printError_63(ds,
                                  "ucol_swap(formatVersion=4): unknown data at IX_RESERVED10_OFFSET\n"
                                  ,(ulong)(uint)(indexes[9] - indexes[8]));
              *errorCode = U_UNSUPPORTED_ERROR;
              ds_local._4_4_ = 0;
            }
          }
          else {
            udata_printError_63(ds,
                                "ucol_swap(formatVersion=4): unknown data at IX_RESERVED8_OFFSET\n",
                                (ulong)(uint)(indexes[7] - indexes[6]));
            *errorCode = U_UNSUPPORTED_ERROR;
            ds_local._4_4_ = 0;
          }
        }
      }
      else {
        udata_printError_63(ds,
                            "ucol_swap(formatVersion=4): too few bytes (%d after header) for collation data\n"
                            ,(ulong)(uint)length);
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        ds_local._4_4_ = 0;
      }
    }
    else {
      udata_printError_63(ds,
                          "ucol_swap(formatVersion=4): too few bytes (%d after header) for collation data\n"
                          ,(ulong)(uint)length);
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      ds_local._4_4_ = 0;
    }
  }
  else {
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

int32_t
swapFormatVersion4(const UDataSwapper *ds,
                   const void *inData, int32_t length, void *outData,
                   UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }

    const uint8_t *inBytes=(const uint8_t *)inData;
    uint8_t *outBytes=(uint8_t *)outData;

    const int32_t *inIndexes=(const int32_t *)inBytes;
    int32_t indexes[IX_TOTAL_SIZE+1];

    // Need at least IX_INDEXES_LENGTH and IX_OPTIONS.
    if(0<=length && length<8) {
        udata_printError(ds, "ucol_swap(formatVersion=4): too few bytes "
                         "(%d after header) for collation data\n",
                         length);
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    int32_t indexesLength=indexes[0]=udata_readInt32(ds, inIndexes[0]);
    if(0<=length && length<(indexesLength*4)) {
        udata_printError(ds, "ucol_swap(formatVersion=4): too few bytes "
                         "(%d after header) for collation data\n",
                         length);
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    for(int32_t i=1; i<=IX_TOTAL_SIZE && i<indexesLength; ++i) {
        indexes[i]=udata_readInt32(ds, inIndexes[i]);
    }
    for(int32_t i=indexesLength; i<=IX_TOTAL_SIZE; ++i) {
        indexes[i]=-1;
    }
    inIndexes=NULL;  // Make sure we do not accidentally use these instead of indexes[].

    // Get the total length of the data.
    int32_t size;
    if(indexesLength>IX_TOTAL_SIZE) {
        size=indexes[IX_TOTAL_SIZE];
    } else if(indexesLength>IX_REORDER_CODES_OFFSET) {
        size=indexes[indexesLength-1];
    } else {
        size=indexesLength*4;
    }
    if(length<0) { return size; }

    if(length<size) {
        udata_printError(ds, "ucol_swap(formatVersion=4): too few bytes "
                         "(%d after header) for collation data\n",
                         length);
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    // Copy the data for inaccessible bytes and arrays of bytes.
    if(inBytes!=outBytes) {
        uprv_memcpy(outBytes, inBytes, size);
    }

    // Swap the int32_t indexes[].
    ds->swapArray32(ds, inBytes, indexesLength * 4, outBytes, &errorCode);

    // The following is a modified version of CollationDataReader::read().
    // Here we use indexes[] not inIndexes[] because
    // the inIndexes[] may not be in this machine's endianness.
    int32_t index;  // one of the indexes[] slots
    int32_t offset;  // byte offset for the index part
    // int32_t length;  // number of bytes in the index part

    index = IX_REORDER_CODES_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray32(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    // Skip the IX_REORDER_TABLE_OFFSET byte array.

    index = IX_TRIE_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        utrie2_swap(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_RESERVED8_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        udata_printError(ds, "ucol_swap(formatVersion=4): unknown data at IX_RESERVED8_OFFSET\n", length);
        errorCode = U_UNSUPPORTED_ERROR;
        return 0;
    }

    index = IX_CES_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray64(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_RESERVED10_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        udata_printError(ds, "ucol_swap(formatVersion=4): unknown data at IX_RESERVED10_OFFSET\n", length);
        errorCode = U_UNSUPPORTED_ERROR;
        return 0;
    }

    index = IX_CE32S_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray32(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_ROOT_ELEMENTS_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray32(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_CONTEXTS_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray16(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_UNSAFE_BWD_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray16(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_FAST_LATIN_TABLE_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray16(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_SCRIPTS_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray16(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    // Skip the  IX_COMPRESSIBLE_BYTES_OFFSET byte array.

    index = IX_RESERVED18_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        udata_printError(ds, "ucol_swap(formatVersion=4): unknown data at IX_RESERVED18_OFFSET\n", length);
        errorCode = U_UNSUPPORTED_ERROR;
        return 0;
    }

    return size;
}